

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O3

void test_3d_static<1ul,30ul,30ul>(void)

{
  long lVar1;
  _Head_base<0UL,_int,_false> *t;
  value_type true_idx;
  tuple<int,_int,_int> dptr [900];
  _Head_base<1UL,_int,_false> local_2a8c;
  _Head_base<2UL,_int,_false> local_2a88;
  _Head_base<0UL,_int,_false> local_2a84;
  tuple<int,_int,_int> *local_2a80;
  tuple<int,_int,_int> *local_2a78;
  tuple<int,_int,_int> *local_2a70;
  tuple<int,_int,_int> local_2a68 [900];
  
  local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl._0_1_ = 1;
  local_2a80._0_1_ = 1;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x106,"void test_3d_static() [X = 1UL, Y = 30UL, Z = 30UL]",(bool *)local_2a68,
             (bool *)&local_2a80);
  local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl._0_1_ = 0;
  local_2a80._0_1_ = 0;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x108,"void test_3d_static() [X = 1UL, Y = 30UL, Z = 30UL]",(bool *)local_2a68,
             (bool *)&local_2a80);
  local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl._0_1_ = 0;
  local_2a80._0_1_ = 0;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(1))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x109,"void test_3d_static() [X = 1UL, Y = 30UL, Z = 30UL]",(bool *)local_2a68,
             (bool *)&local_2a80);
  local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
       (_Tuple_impl<1UL,_int,_int>)
       ((ulong)(uint7)local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.
                      super__Tuple_impl<1UL,_int,_int>._1_7_ << 8);
  local_2a80 = (tuple<int,_int,_int> *)((ulong)local_2a80._1_7_ << 8);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(2))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10a,"void test_3d_static() [X = 1UL, Y = 30UL, Z = 30UL]",(bool *)local_2a68,
             (bool *)&local_2a80);
  local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)0x1;
  local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = 0;
  local_2a80 = (tuple<int,_int,_int> *)CONCAT44(local_2a80._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10c,"void test_3d_static() [X = 1UL, Y = 30UL, Z = 30UL]",
             (unsigned_long *)local_2a68,(int *)&local_2a80);
  local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)0x1;
  local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = 0;
  local_2a80 = (tuple<int,_int,_int> *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(1))","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10d,"void test_3d_static() [X = 1UL, Y = 30UL, Z = 30UL]",
             (unsigned_long *)local_2a68,(unsigned_long *)&local_2a80);
  local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)0x1e;
  local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = 0;
  local_2a80 = (tuple<int,_int,_int> *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(2))","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10e,"void test_3d_static() [X = 1UL, Y = 30UL, Z = 30UL]",
             (unsigned_long *)local_2a68,(unsigned_long *)&local_2a80);
  local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)0x384;
  local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = 0;
  local_2a80 = (tuple<int,_int,_int> *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y * Z",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x110,"void test_3d_static() [X = 1UL, Y = 30UL, Z = 30UL]",
             (unsigned_long *)local_2a68,(unsigned_long *)&local_2a80);
  local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)0x384;
  local_2a68[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = 0;
  local_2a80 = (tuple<int,_int,_int> *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y * Z",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x111,"void test_3d_static() [X = 1UL, Y = 30UL, Z = 30UL]",
             (unsigned_long *)local_2a68,(unsigned_long *)&local_2a80);
  memset(local_2a68,0,0x2a30);
  local_2a88._M_head_impl = 0;
  do {
    local_2a8c._M_head_impl = 0;
    do {
      local_2a84._M_head_impl = 0;
      do {
        local_2a80 = (tuple<int,_int,_int> *)
                     ((long)local_2a88._M_head_impl * 0x1e + (long)local_2a8c._M_head_impl);
        local_2a78 = local_2a80;
        boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                  ("(l.index(i, j, k))","true_idx",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x11c,"void test_3d_static() [X = 1UL, Y = 30UL, Z = 30UL]",
                   (unsigned_long *)&local_2a78,(unsigned_long *)&local_2a80);
        local_2a78 = local_2a68 +
                     (long)local_2a88._M_head_impl * 0x1e +
                     (long)local_2a8c._M_head_impl + (long)local_2a84._M_head_impl;
        local_2a70 = local_2a68 + (long)local_2a80;
        boost::detail::test_eq_impl<std::tuple<int,int,int>*,std::tuple<int,int,int>*>
                  ("&(dptr[l.index(i, j, k)])","&(dptr[true_idx])",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x11e,"void test_3d_static() [X = 1UL, Y = 30UL, Z = 30UL]",&local_2a78,
                   &local_2a70);
        lVar1 = (long)local_2a8c._M_head_impl + (long)local_2a84._M_head_impl +
                (long)local_2a88._M_head_impl * 0x1e;
        t = &local_2a68[lVar1].super__Tuple_impl<0UL,_int,_int,_int>.
             super__Head_base<0UL,_int,_false>;
        t->_M_head_impl = local_2a84._M_head_impl;
        local_2a68[lVar1].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl = local_2a8c._M_head_impl;
        local_2a68[lVar1].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false> =
             (_Head_base<2UL,_int,_false>)local_2a88._M_head_impl;
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(dptr[l.index(i, j, k)]))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x124,"void test_3d_static() [X = 1UL, Y = 30UL, Z = 30UL]",&t->_M_head_impl,
                   &local_2a84._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(dptr[l.index(i, j, k)]))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x125,"void test_3d_static() [X = 1UL, Y = 30UL, Z = 30UL]",
                   &local_2a68
                    [(long)local_2a88._M_head_impl * 0x1e +
                     (long)local_2a8c._M_head_impl + (long)local_2a84._M_head_impl].
                    super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
                    super__Head_base<1UL,_int,_false>._M_head_impl,&local_2a8c._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(dptr[l.index(i, j, k)]))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x126,"void test_3d_static() [X = 1UL, Y = 30UL, Z = 30UL]",
                   (int *)(local_2a68 +
                          (long)local_2a88._M_head_impl * 0x1e +
                          (long)local_2a8c._M_head_impl + (long)local_2a84._M_head_impl),
                   &local_2a88._M_head_impl);
        local_2a84._M_head_impl = local_2a84._M_head_impl + 1;
      } while (local_2a84._M_head_impl == 0);
      local_2a8c._M_head_impl = local_2a8c._M_head_impl + 1;
    } while ((uint)local_2a8c._M_head_impl < 0x1e);
    local_2a88._M_head_impl = local_2a88._M_head_impl + 1;
  } while ((uint)local_2a88._M_head_impl < 0x1e);
  return;
}

Assistant:

void test_3d_static()
{ // {{{
    layout_mapping_left<
        dimensions<X, Y, Z>, dimensions<1, 1, 1>, dimensions<0, 0, 0>
    >  const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(1)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(2)), false);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), X);
    BOOST_TEST_EQ((l.stride(2)), X * Y);

    BOOST_TEST_EQ((l.size()), X * Y * Z);
    BOOST_TEST_EQ((l.span()), X * Y * Z);

    tuple<int, int, int> dptr[X * Y * Z];

    // Set all elements to a unique value.
    for (auto k = 0; k < l[2]; ++k)
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j) + (l[0]) * (l[1]) * (k);

        BOOST_TEST_EQ((l.index(i, j, k)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j, k)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j, k)]) = i;
        std::get<1>(dptr[l.index(i, j, k)]) = j;
        std::get<2>(dptr[l.index(i, j, k)]) = k;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j, k)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j, k)])), j); 
        BOOST_TEST_EQ((std::get<2>(dptr[l.index(i, j, k)])), k); 
    }
}